

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_char.c
# Opt level: O3

int bin_char_equal(char *vec1,char *vec2,int len)

{
  ulong uVar1;
  int iVar2;
  
  if (0 < len) {
    uVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (char)(vec2[uVar1] ^ vec1[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
    return (int)(iVar2 == 0);
  }
  return 1;
}

Assistant:

int bin_char_equal(char *vec1, char *vec2, int len)
    {
        int sum=0;
        for(int i=0; i<len; i++)
            {
                sum+=vec1[i]^vec2[i];
                // printf("\n%i\n",sum);
            }
        if(sum==0) return 1;
        else return 0;
    }